

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::cleanup::ChunkList::AddFallback
          (ChunkList *this,void *elem,_func_void_void_ptr *destructor,SerialArena *arena)

{
  CleanupNode **v1;
  CleanupNode **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  AllocationPolicy *policy_ptr;
  CleanupNode *pCVar2;
  size_t sVar3;
  SizedPtr SVar4;
  size_t local_c0;
  Chunk *local_90;
  SizedPtr mem;
  LogMessage local_70;
  Voidify local_59;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  SerialArena *arena_local;
  _func_void_void_ptr *destructor_local;
  void *elem_local;
  ChunkList *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)arena;
  arena_local = (SerialArena *)destructor;
  destructor_local = (_func_void_void_ptr *)elem;
  elem_local = this;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::cleanup::CleanupNode*>(&this->next_);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::cleanup::CleanupNode*>(&this->limit_);
  local_58 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::internal::cleanup::CleanupNode*,google::protobuf::internal::cleanup::CleanupNode*>
                       (v1,v2,"next_ == limit_");
  if (local_58 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_58);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
               ,0x81,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_70);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_59,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_70);
  }
  policy_ptr = ThreadSafeArena::AllocPolicy
                         (*(ThreadSafeArena **)(absl_log_internal_check_op_result + 0x60));
  if (this->head_ == (Chunk *)0x0) {
    local_c0 = 0;
  }
  else {
    local_c0 = this->head_->size;
  }
  SVar4 = anon_unknown_12::AllocateCleanupChunk(policy_ptr,local_c0);
  mem.p = (void *)SVar4.n;
  SerialArena::AddSpaceAllocated((SerialArena *)absl_log_internal_check_op_result,(size_t)mem.p);
  local_90 = (Chunk *)SVar4.p;
  local_90->next = this->head_;
  local_90->size = (size_t)mem.p;
  this->head_ = local_90;
  pCVar2 = Chunk::First(this->head_);
  this->next_ = pCVar2;
  this->prefetch_ptr_ = (char *)this->next_;
  pCVar2 = this->next_;
  sVar3 = Chunk::Capacity((size_t)mem.p);
  this->limit_ = pCVar2 + sVar3;
  pCVar2 = this->next_;
  this->next_ = pCVar2 + 1;
  pCVar2->elem = destructor_local;
  pCVar2->destructor = (_func_void_void_ptr *)arena_local;
  return;
}

Assistant:

void ChunkList::AddFallback(
    void* PROTOBUF_NONNULL elem,
    void (*PROTOBUF_NONNULL destructor)(void* PROTOBUF_NONNULL),
    SerialArena& arena) {
  ABSL_DCHECK_EQ(next_, limit_);
  SizedPtr mem = AllocateCleanupChunk(arena.parent_.AllocPolicy(),
                                      head_ == nullptr ? 0 : head_->size);
  arena.AddSpaceAllocated(mem.n);
  head_ = new (mem.p) Chunk{head_, mem.n};
  next_ = head_->First();
  prefetch_ptr_ = reinterpret_cast<char*>(next_);
  limit_ = next_ + Chunk::Capacity(mem.n);
  AddFromExisting(elem, destructor);
}